

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandAutoTuner(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  uint local_50;
  int fVerbose;
  int nCores;
  int c;
  char *pFileName;
  char *pFileList;
  char *pFileConf;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pFileList = (char *)0x0;
  pFileName = (char *)0x0;
  local_50 = 3;
  bVar1 = false;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          iVar2 = Extra_UtilGetopt(argc,argv,"NCFvh");
          if (iVar2 == -1) {
            if (pFileList == (char *)0x0) {
              Abc_Print(-2,"File containing configuration for autotuning is not given.\n");
              return 1;
            }
            if (pFileName == (char *)0x0) {
              Abc_Print(-2,"File contining list of files for autotuning is not given.\n");
              return 1;
            }
            pFVar3 = (FILE *)Io_FileOpen(pFileList,"open_path","rb",0);
            if (pFVar3 == (FILE *)0x0) {
              Abc_Print(-2,"Cannot open configuration file \"%s\". ",pFileList);
              pcVar4 = Extra_FileGetSimilarName(pFileList,".c",".s",".scr",".script",(char *)0x0);
              if (pcVar4 != (char *)0x0) {
                Abc_Print(-2,"Did you mean \"%s\"?",pcVar4);
              }
              Abc_Print(-2,"\n");
              return 1;
            }
            fclose(pFVar3);
            pFVar3 = (FILE *)Io_FileOpen(pFileName,"open_path","rb",0);
            if (pFVar3 == (FILE *)0x0) {
              Abc_Print(-2,"Cannot open the file list \"%s\". ",pFileName);
              pcVar4 = Extra_FileGetSimilarName(pFileName,".c",".s",".scr",".script",(char *)0x0);
              if (pcVar4 != (char *)0x0) {
                Abc_Print(-2,"Did you mean \"%s\"?",pcVar4);
              }
              Abc_Print(-2,"\n");
              return 1;
            }
            fclose(pFVar3);
            Cmd_RunAutoTuner(pFileList,pFileName,local_50);
            return 0;
          }
          if (iVar2 != 0x43) break;
          if (argc <= globalUtilOptind) {
            Abc_Print(-1,
                      "Command line switch \"-C\" should be followed by a string (possibly in quotes).\n"
                     );
            goto LAB_00b1ddae;
          }
          pFileList = argv[globalUtilOptind];
          globalUtilOptind = globalUtilOptind + 1;
        }
        if (iVar2 != 0x46) break;
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,
                    "Command line switch \"-F\" should be followed by a string (possibly in quotes).\n"
                   );
          goto LAB_00b1ddae;
        }
        pFileName = argv[globalUtilOptind];
        globalUtilOptind = globalUtilOptind + 1;
      }
      if (iVar2 == 0x4e) break;
      if ((iVar2 == 0x68) || (iVar2 != 0x76)) goto LAB_00b1ddae;
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      break;
    }
    local_50 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < (int)local_50);
LAB_00b1ddae:
  Abc_Print(-2,"usage: autotuner [-N num] [-C file] [-F file] [-vh]\n");
  Abc_Print(-2,"\t         performs autotuning\n");
  Abc_Print(-2,"\t-N num : the number of concurrent jobs including the controler [default = %d]\n",
            (ulong)local_50);
  Abc_Print(-2,"\t-C cmd : configuration file with settings for autotuning\n");
  Abc_Print(-2,"\t-F cmd : list of AIGER files to be used for autotuning\n");
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int CmdCommandAutoTuner( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Cmd_RunAutoTuner( char * pConfig, char * pFileList, int nCores );
    FILE * pFile;
    char * pFileConf = NULL;
    char * pFileList = NULL;
    char * pFileName;
    int c, nCores    =  3;
    int fVerbose     =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NCFvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nCores = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCores < 0 ) 
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a string (possibly in quotes).\n" );
                goto usage;
            }
            pFileConf = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a string (possibly in quotes).\n" );
                goto usage;
            }
            pFileList = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pFileConf == NULL )
    {
        Abc_Print( -2, "File containing configuration for autotuning is not given.\n" );
        return 1;
    }
    if ( pFileList == NULL )
    {
        Abc_Print( -2, "File contining list of files for autotuning is not given.\n" );
        return 1;
    }
    // get the input file name
    pFileName = pFileConf;
    if ( (pFile = Io_FileOpen( pFileName, "open_path", "rb", 0 )) == NULL )
//    if ( (pFile = fopen( pFileName, "rb" )) == NULL )
    {
        Abc_Print( -2, "Cannot open configuration file \"%s\". ", pFileName );
        if (( pFileName = Extra_FileGetSimilarName( pFileName, ".c", ".s", ".scr", ".script", NULL ) ))
            Abc_Print( -2, "Did you mean \"%s\"?", pFileName );
        Abc_Print( -2, "\n" );
        return 1;
    }
    fclose( pFile );
    // get the input file name
    pFileName = pFileList;
    if ( (pFile = Io_FileOpen( pFileName, "open_path", "rb", 0 )) == NULL )
//    if ( (pFile = fopen( pFileName, "rb" )) == NULL )
    {
        Abc_Print( -2, "Cannot open the file list \"%s\". ", pFileName );
        if (( pFileName = Extra_FileGetSimilarName( pFileName, ".c", ".s", ".scr", ".script", NULL ) ))
            Abc_Print( -2, "Did you mean \"%s\"?", pFileName );
        Abc_Print( -2, "\n" );
        return 1;
    }
    fclose( pFile );
    // run commands
    Cmd_RunAutoTuner( pFileConf, pFileList, nCores );
    return 0;

usage:
    Abc_Print( -2, "usage: autotuner [-N num] [-C file] [-F file] [-vh]\n" );
    Abc_Print( -2, "\t         performs autotuning\n" );
    Abc_Print( -2, "\t-N num : the number of concurrent jobs including the controler [default = %d]\n", nCores );
    Abc_Print( -2, "\t-C cmd : configuration file with settings for autotuning\n" );
    Abc_Print( -2, "\t-F cmd : list of AIGER files to be used for autotuning\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}